

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

void __thiscall despot::BaseTag::ReadConfig(BaseTag *this,istream *is)

{
  int iVar1;
  istream *piVar2;
  istream *piVar3;
  BaseTag *this_00;
  long lVar4;
  int w;
  int h;
  int o;
  string line;
  string val;
  string key;
  istringstream iss;
  int local_260;
  int local_25c;
  istream *local_258;
  undefined1 local_24c [4];
  string local_248;
  BaseTag *local_228;
  undefined1 *local_220;
  undefined8 local_218;
  undefined1 local_210 [16];
  vector<despot::Coord,_std::allocator<despot::Coord>_> *local_200;
  Coord local_1f8 [8];
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [16];
  Floor local_1b0;
  ios_base local_138 [264];
  
  local_220 = local_210;
  local_218._0_4_ = 0;
  local_218._4_1_ = (BeliefMDP)0x0;
  local_218._5_3_ = 0;
  local_210[0] = 0;
  local_1d0 = local_1c0;
  local_1c8 = 0;
  local_1c0[0] = 0;
  local_1f0 = local_1e0;
  local_1e8 = 0;
  local_1e0[0] = 0;
  local_200 = &(this->floor_).cells_;
  local_258 = is;
  local_228 = this;
  while( true ) {
    piVar2 = std::operator>>(local_258,(string *)&local_1d0);
    piVar2 = std::operator>>(piVar2,(string *)&local_1f0);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    iVar1 = std::__cxx11::string::compare((char *)&local_1d0);
    if (iVar1 == 0) {
      piVar3 = (istream *)std::istream::operator>>((istream *)local_258,&local_25c);
      std::istream::operator>>(piVar3,&local_260);
      despot::Floor::Floor(&local_1b0,local_25c,local_260);
      (this->floor_).num_rows_ = local_1b0.num_rows_;
      (this->floor_).num_cols_ = local_1b0.num_cols_;
      *(undefined4 *)&(this->floor_).floor_ = local_1b0.floor_._0_4_;
      *(undefined4 *)((long)&(this->floor_).floor_ + 4) = local_1b0.floor_._4_4_;
      std::vector<despot::Coord,_std::allocator<despot::Coord>_>::_M_move_assign
                (local_200,&local_1b0.cells_);
      local_248._M_dataplus._M_p =
           (pointer)(local_228->floor_).dist_.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_248._M_string_length =
           (size_type)
           (local_228->floor_).dist_.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_248.field_2._M_allocated_capacity =
           (size_type)
           (local_228->floor_).dist_.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (local_228->floor_).dist_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_1b0.dist_.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (local_228->floor_).dist_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_1b0.dist_.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (local_228->floor_).dist_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1b0.dist_.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1b0.dist_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b0.dist_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b0.dist_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&local_248);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_1b0.dist_);
      if (local_1b0.cells_.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b0.cells_.
                        super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1b0.cells_.
                              super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b0.cells_.
                              super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (0 < local_25c) {
        iVar1 = 0;
        do {
          std::operator>>(local_258,(string *)&local_220);
          if (0 < local_260) {
            lVar4 = 0;
            do {
              if (local_220[lVar4] != '#') {
                despot::Coord::Coord(local_1f8,(int)lVar4,iVar1);
                despot::Floor::AddCell(&this->floor_,local_1f8);
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 < local_260);
          }
          iVar1 = iVar1 + 1;
        } while (iVar1 < local_25c);
      }
      despot::Floor::ComputeDistances();
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_1d0);
      if (iVar1 == 0) {
        piVar3 = (istream *)std::istream::operator>>((istream *)local_258,&local_25c);
        piVar3 = (istream *)std::istream::operator>>(piVar3,&local_260);
        this_00 = (BaseTag *)local_24c;
        std::istream::operator>>(piVar3,(int *)this_00);
        RandomMap_abi_cxx11_(&local_248,this_00,local_25c,local_260,(int)local_24c);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&local_1b0,(string *)&local_248,_S_in);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,
                          (ulong)(local_248.field_2._M_allocated_capacity + 1));
        }
        ReadConfig(local_228,(istream *)&local_1b0);
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
        std::ios_base::~ios_base(local_138);
      }
    }
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,CONCAT71(local_1e0._1_7_,local_1e0[0]) + 1);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,CONCAT71(local_1c0._1_7_,local_1c0[0]) + 1);
  }
  if (local_220 != local_210) {
    operator_delete(local_220,CONCAT71(local_210._1_7_,local_210[0]) + 1);
  }
  return;
}

Assistant:

void BaseTag::ReadConfig(istream& is) {
	string line, key, val;
	while (is >> key >> val) {
		if (key == "mapSize") {
			int nrows, ncols;
			is >> nrows >> ncols;
			floor_ = Floor(nrows, ncols);

			for (int y = 0; y < nrows; y++) {
				is >> line;
				for (int x = 0; x < ncols; x++) {
					if (line[x] != '#') {
						floor_.AddCell(Coord(x, y));
					}
				}
			}

			floor_.ComputeDistances();
		} else if (key == "width-height-obstacles") {
			int h, w, o;
			is >> h >> w >> o;
			istringstream iss(RandomMap(h, w, o));
			ReadConfig(iss);
		}
	}
}